

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

wchar_t vorbis_finish_frame(stb_vorbis *f,wchar_t len,wchar_t left,wchar_t right)

{
  long lVar1;
  wchar_t wVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  wVar2 = f->previous_length;
  if ((long)wVar2 != 0) {
    lVar1 = 0x5b8;
    if ((wVar2 * 2 == f->blocksize_0) || (lVar1 = 0x5c0, wVar2 * 2 == f->blocksize_1)) {
      lVar1 = *(long *)((long)&f->sample_rate + lVar1);
    }
    else {
      lVar1 = 0;
    }
    if (lVar1 == 0) {
      return L'\0';
    }
    if (L'\0' < f->channels) {
      lVar4 = 0;
      do {
        if (L'\0' < wVar2) {
          uVar3 = 0;
          lVar5 = (long)wVar2;
          do {
            lVar5 = lVar5 + -1;
            f->channel_buffers[lVar4][(long)left + uVar3] =
                 f->channel_buffers[lVar4][(long)left + uVar3] * *(float *)(lVar1 + uVar3 * 4) +
                 f->previous_window[lVar4][uVar3] * *(float *)(lVar1 + lVar5 * 4);
            uVar3 = uVar3 + 1;
          } while ((uint)wVar2 != uVar3);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < f->channels);
    }
    if (lVar1 == 0) {
      return L'\0';
    }
  }
  wVar2 = f->previous_length;
  f->previous_length = len - right;
  if (L'\0' < f->channels) {
    lVar1 = 0;
    do {
      if (right < len) {
        uVar3 = 0;
        do {
          f->previous_window[lVar1][uVar3] = f->channel_buffers[lVar1][(long)right + uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)(len - right) != uVar3);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < f->channels);
  }
  if (wVar2 == L'\0') {
    wVar2 = L'\0';
  }
  else {
    if (len < right) {
      right = len;
    }
    wVar2 = right - left;
    f->samples_output = f->samples_output + wVar2;
  }
  return wVar2;
}

Assistant:

static int vorbis_finish_frame(stb_vorbis *f, int len, int left, int right)
{
   int prev,i,j;
   // we use right&left (the start of the right- and left-window sin()-regions)
   // to determine how much to return, rather than inferring from the rules
   // (same result, clearer code); 'left' indicates where our sin() window
   // starts, therefore where the previous window's right edge starts, and
   // therefore where to start mixing from the previous buffer. 'right'
   // indicates where our sin() ending-window starts, therefore that's where
   // we start saving, and where our returned-data ends.

   // mixin from previous window
   if (f->previous_length) {
      int i,j, n = f->previous_length;
      float *w = get_window(f, n);
      if (w == NULL) return 0;
      for (i=0; i < f->channels; ++i) {
         for (j=0; j < n; ++j)
            f->channel_buffers[i][left+j] =
               f->channel_buffers[i][left+j]*w[    j] +
               f->previous_window[i][     j]*w[n-1-j];
      }
   }

   prev = f->previous_length;

   // last half of this data becomes previous window
   f->previous_length = len - right;

   // @OPTIMIZE: could avoid this copy by double-buffering the
   // output (flipping previous_window with channel_buffers), but
   // then previous_window would have to be 2x as large, and
   // channel_buffers couldn't be temp mem (although they're NOT
   // currently temp mem, they could be (unless we want to level
   // performance by spreading out the computation))
   for (i=0; i < f->channels; ++i)
      for (j=0; right+j < len; ++j)
         f->previous_window[i][j] = f->channel_buffers[i][right+j];

   if (!prev)
      // there was no previous packet, so this data isn't valid...
      // this isn't entirely true, only the would-have-overlapped data
      // isn't valid, but this seems to be what the spec requires
      return 0;

   // truncate a short frame
   if (len < right) right = len;

   f->samples_output += right-left;

   return right - left;
}